

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall QAccessibleComboBox::QAccessibleComboBox(QAccessibleComboBox *this,QWidget *w)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_00;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w_00 = in_RDI;
  QString::QString((QString *)0x7d4da2);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w_00,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7d4dc4);
  *(undefined ***)in_RDI = &PTR__QAccessibleComboBox_00d27608;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleComboBox_00d276e0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleComboBox::QAccessibleComboBox(QWidget *w)
: QAccessibleWidget(w, QAccessible::ComboBox)
{
    Q_ASSERT(comboBox());
}